

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::finish(search *sch)

{
  task_data *this;
  search *in_RDI;
  task_data *D;
  
  this = Search::search::get_task_data<GraphTask::task_data>(in_RDI);
  free(this->neighbor_predictions);
  free(this->confusion_matrix);
  free(this->true_counts);
  if (this != (task_data *)0x0) {
    task_data::~task_data(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void finish(Search::search& sch)
{
  task_data* D = sch.get_task_data<task_data>();
  free(D->neighbor_predictions);
  free(D->confusion_matrix);
  free(D->true_counts);
  delete D;
}